

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O1

void __thiscall
crnlib::dxt1_endpoint_optimizer::compute_pca
          (dxt1_endpoint_optimizer *this,vec3F *axis,vec3F_array *norm_colors,vec3F *def)

{
  float fVar1;
  uint i;
  uint uVar2;
  long lVar3;
  uint uVar4;
  float *pfVar5;
  ulong uVar6;
  bool bVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  float fVar18;
  float fVar20;
  double dVar19;
  double dVar21;
  double dVar22;
  undefined1 auVar23 [16];
  double dVar24;
  
  if ((ulong)norm_colors->m_size == 0) {
    dVar8 = 0.0;
    dVar9 = 0.0;
    dVar10 = 0.0;
    dVar11 = 0.0;
    dVar12 = 0.0;
    dVar13 = 0.0;
  }
  else {
    pfVar5 = norm_colors->m_p->m_s + 1;
    dVar8 = 0.0;
    dVar9 = 0.0;
    uVar6 = 0;
    dVar10 = 0.0;
    dVar11 = 0.0;
    dVar12 = 0.0;
    dVar13 = 0.0;
    do {
      fVar1 = ((vec<3U,_float> *)(pfVar5 + -1))->m_s[0];
      uVar2 = (this->m_unique_colors).m_p[uVar6].m_weight;
      fVar18 = (float)*(undefined8 *)pfVar5;
      fVar20 = (float)((ulong)*(undefined8 *)pfVar5 >> 0x20);
      if (uVar2 < 2) {
        dVar14 = (double)(fVar1 * fVar1);
        dVar15 = (double)(fVar1 * fVar18);
        dVar16 = (double)(fVar1 * fVar20);
        dVar17 = (double)(fVar18 * fVar20);
        dVar19 = (double)(fVar18 * fVar18);
        dVar21 = (double)(fVar20 * fVar20);
      }
      else {
        dVar21 = (double)uVar2;
        dVar14 = (double)(fVar1 * fVar1) * dVar21;
        dVar15 = (double)(fVar1 * fVar18) * dVar21;
        dVar16 = (double)(fVar1 * fVar20) * dVar21;
        dVar17 = (double)(fVar18 * fVar20) * dVar21;
        dVar19 = (double)(fVar18 * fVar18) * dVar21;
        dVar21 = (double)(fVar20 * fVar20) * dVar21;
      }
      dVar12 = dVar12 + dVar19;
      dVar13 = dVar13 + dVar21;
      dVar10 = dVar10 + dVar16;
      dVar11 = dVar11 + dVar17;
      dVar8 = dVar8 + dVar14;
      dVar9 = dVar9 + dVar15;
      uVar6 = uVar6 + 1;
      pfVar5 = pfVar5 + 3;
    } while (norm_colors->m_size != uVar6);
  }
  dVar14 = 0.699999988079071;
  dVar15 = 0.8999999761581421;
  dVar16 = 1.0;
  uVar2 = 0;
  do {
    dVar19 = dVar14 * dVar10 + dVar16 * dVar9 + dVar15 * dVar8;
    dVar21 = dVar14 * dVar11 + dVar16 * dVar12 + dVar15 * dVar9;
    dVar24 = dVar13 * dVar14 + dVar11 * dVar16 + dVar10 * dVar15;
    dVar17 = ABS(dVar19);
    if (ABS(dVar19) <= ABS(dVar21)) {
      dVar17 = ABS(dVar21);
    }
    if (dVar17 <= ABS(dVar24)) {
      dVar17 = ABS(dVar24);
    }
    dVar22 = 1.0 / dVar17;
    if (1e-10 < dVar17) {
      dVar24 = dVar24 * dVar22;
    }
    uVar4 = (uint)(1e-10 < dVar17);
    auVar23._0_8_ = CONCAT44((int)(uVar4 << 0x1f) >> 0x1f,(int)(uVar4 << 0x1f) >> 0x1f);
    auVar23._8_4_ = (int)(uVar4 << 0x1f) >> 0x1f;
    auVar23._12_4_ = (int)(uVar4 << 0x1f) >> 0x1f;
    dVar17 = (double)(~auVar23._0_8_ & (ulong)dVar19 | (ulong)(dVar22 * dVar19) & auVar23._0_8_);
    dVar19 = (double)(~auVar23._8_8_ & (ulong)dVar21 | (ulong)(dVar22 * dVar21) & auVar23._8_8_);
  } while ((uVar2 < 3 ||
            1e-08 <= (dVar14 - dVar24) * (dVar14 - dVar24) +
                     (dVar16 - dVar19) * (dVar16 - dVar19) + (dVar15 - dVar17) * (dVar15 - dVar17))
          && (bVar7 = uVar2 != 7, dVar14 = dVar24, dVar15 = dVar17, dVar16 = dVar19,
             uVar2 = uVar2 + 1, bVar7));
  dVar8 = dVar24 * dVar24 + dVar19 * dVar19 + dVar17 * dVar17;
  if (1e-10 <= dVar8) {
    if (dVar8 < 0.0) {
      dVar8 = sqrt(dVar8);
    }
    else {
      dVar8 = SQRT(dVar8);
    }
    dVar8 = 1.0 / dVar8;
    *(ulong *)axis->m_s = CONCAT44((float)(dVar19 * dVar8),(float)(dVar17 * dVar8));
    axis->m_s[2] = (float)(dVar24 * dVar8);
  }
  else if (axis != def) {
    lVar3 = 0;
    do {
      axis->m_s[lVar3] = def->m_s[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
  }
  return;
}

Assistant:

void dxt1_endpoint_optimizer::compute_pca(vec3F& axis, const vec3F_array& norm_colors, const vec3F& def) {
  double cov[6] = {0, 0, 0, 0, 0, 0};
  for (uint i = 0; i < norm_colors.size(); i++) {
    const vec3F& v = norm_colors[i];
    float r = v[0];
    float g = v[1];
    float b = v[2];
    if (m_unique_colors[i].m_weight > 1) {
      const double weight = m_unique_colors[i].m_weight;
      cov[0] += r * r * weight;
      cov[1] += r * g * weight;
      cov[2] += r * b * weight;
      cov[3] += g * g * weight;
      cov[4] += g * b * weight;
      cov[5] += b * b * weight;
    } else {
      cov[0] += r * r;
      cov[1] += r * g;
      cov[2] += r * b;
      cov[3] += g * g;
      cov[4] += g * b;
      cov[5] += b * b;
    }
  }
  double vfr = .9f;
  double vfg = 1.0f;
  double vfb = .7f;
  for (uint iter = 0; iter < 8; iter++) {
    double r = vfr * cov[0] + vfg * cov[1] + vfb * cov[2];
    double g = vfr * cov[1] + vfg * cov[3] + vfb * cov[4];
    double b = vfr * cov[2] + vfg * cov[4] + vfb * cov[5];
    double m = math::maximum(fabs(r), fabs(g), fabs(b));
    if (m > 1e-10) {
      m = 1.0f / m;
      r *= m;
      g *= m;
      b *= m;
    }
    double delta = math::square(vfr - r) + math::square(vfg - g) + math::square(vfb - b);
    vfr = r;
    vfg = g;
    vfb = b;
    if ((iter > 2) && (delta < 1e-8))
      break;
  }
  double len = vfr * vfr + vfg * vfg + vfb * vfb;
  if (len < 1e-10) {
    axis = def;
  } else {
    len = 1.0f / sqrt(len);
    axis.set(static_cast<float>(vfr * len), static_cast<float>(vfg * len), static_cast<float>(vfb * len));
  }
}